

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  float fVar2;
  Precision PVar3;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar4;
  ShaderExecutor *pSVar5;
  Variable<tcu::Vector<float,_2>_> *pVVar6;
  pointer pcVar7;
  Variable<float> *pVVar8;
  double dVar9;
  TestLog *pTVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  undefined8 uVar14;
  IVal *pIVar15;
  IVal *x;
  undefined8 *puVar16;
  Vector<float,_2> *val;
  size_t sVar17;
  long lVar18;
  IVal IVar19;
  double *pdVar20;
  undefined1 auVar21 [8];
  FloatFormat *fmt;
  long lVar22;
  long lVar23;
  TestStatus *pTVar24;
  double dVar25;
  FuncSet funcs;
  IVal reference1;
  IVal in2;
  IVal in3;
  IVal in0;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  ostringstream oss;
  void *inputArr [4];
  ResultCollector status;
  deUint32 in_stack_fffffffffffffaa8;
  undefined1 local_548 [8];
  undefined8 local_540;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_538;
  _Rb_tree_node_base *local_528;
  size_t local_520;
  IVal local_511;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_510;
  pointer local_508;
  string local_500;
  size_t local_4e0;
  TestLog *local_4d8;
  double dStack_4d0;
  _Base_ptr p_Stack_4c8;
  TestStatus *local_4b8;
  FloatFormat *local_4b0;
  undefined1 local_4a8 [8];
  double dStack_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_498;
  Vector<float,_2> *local_488;
  double dStack_480;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_478;
  undefined4 local_470;
  ios_base local_438 [8];
  ios_base local_430 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_328;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> local_2f8;
  FloatFormat local_2c8;
  pointer local_298;
  pointer local_290;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_280;
  IVal local_220 [2];
  ios_base local_1b0 [264];
  pointer local_a8;
  pointer local_a0;
  pointer local_98;
  pointer local_90;
  ResultCollector local_80;
  
  this_00 = this->m_samplings;
  fmt = &(this->m_caseCtx).floatFormat;
  PVar3 = (this->m_caseCtx).precision;
  sVar17 = (this->m_caseCtx).numRandoms;
  local_4b8 = __return_storage_ptr__;
  iVar12 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_280,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)fmt,(FloatFormat *)(ulong)PVar3,(Precision)sVar17,(ulong)(iVar12 + 0xdeadbeef),
             in_stack_fffffffffffffaa8);
  local_508 = local_280.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  sVar17 = (long)local_280.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_280.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_2f8,sVar17);
  local_2c8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2c8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2c8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2c8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2c8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2c8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2c8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2c8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2c8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_328._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_328._M_impl.super__Rb_tree_header._M_header;
  local_328._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_328._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_328._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_328._M_impl.super__Rb_tree_header._M_header._M_right =
       local_328._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_510 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_a8 = local_280.in0.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_a0 = local_280.in1.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_98 = local_280.in2.
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_90 = local_280.in3.
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_298 = local_2f8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_290 = local_2f8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_4a8 = (undefined1  [8])local_510;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_4a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81((ostringstream *)&dStack_4a0,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_4a0);
  std::ios_base::~ios_base(local_430);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
  local_540 = (double)((ulong)local_540._4_4_ << 0x20);
  aStack_538._M_allocated_capacity = 0;
  local_520 = 0;
  pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  aStack_538._8_8_ = (_Rb_tree_node_base *)&local_540;
  local_528 = (_Rb_tree_node_base *)&local_540;
  local_4e0 = sVar17;
  (*pSVar4->_vptr_Statement[4])(pSVar4,local_548);
  if ((_Rb_tree_node_base *)aStack_538._8_8_ != (_Rb_tree_node_base *)&local_540) {
    uVar14 = aStack_538._8_8_;
    do {
      (**(code **)(**(long **)(uVar14 + 0x20) + 0x30))(*(long **)(uVar14 + 0x20),local_220);
      uVar14 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar14);
    } while ((_Rb_tree_node_base *)uVar14 != (_Rb_tree_node_base *)&local_540);
  }
  sVar17 = local_4e0;
  if (local_520 != 0) {
    local_4a8 = (undefined1  [8])local_510;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_4a0,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_4a0,local_500._M_dataplus._M_p,local_500._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_4a0);
    std::ios_base::~ios_base(local_430);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_548);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
  std::ios_base::~ios_base(local_1b0);
  pSVar5 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar5->_vptr_ShaderExecutor[2])(pSVar5,sVar17 & 0xffffffff,&local_a8,&local_298,0);
  local_4a8 = (undefined1  [8])((ulong)local_4a8 & 0xffffffffffffff00);
  dStack_4a0 = INFINITY;
  aStack_498._M_allocated_capacity = 0xfff0000000000000;
  aStack_498._8_8_ = aStack_498._8_8_ & 0xffffffffffffff00;
  local_488 = (Vector<float,_2> *)0x7ff0000000000000;
  dStack_480 = -INFINITY;
  local_220[0].m_data[0]._0_8_ = local_220[0].m_data[0]._0_8_ & 0xffffffffffffff00;
  local_220[0].m_data[0].m_lo = INFINITY;
  local_220[0].m_data[0].m_hi = -INFINITY;
  local_220[0].m_data[1]._0_4_ = local_220[0].m_data[1]._0_4_ & 0xffffff00;
  local_220[0].m_data[1].m_lo = INFINITY;
  local_220[0].m_data[1].m_hi = -INFINITY;
  local_548._0_4_ = local_548._0_4_ & 0xffffff00;
  local_540 = INFINITY;
  aStack_538._M_allocated_capacity = 0xfff0000000000000;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_328,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_4a8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_328,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             local_220);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_328,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_500);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_328,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4d8);
  Environment::bind<float>
            ((Environment *)&local_328,
             (this->m_variables).out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)local_548);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_328,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_511);
  if (local_280.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == local_508) {
LAB_0085c916:
    local_4a8 = (undefined1  [8])local_510;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"All ",4);
    pTVar24 = local_4b8;
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_4a0);
    std::ios_base::~ios_base(local_430);
    local_4a8 = (undefined1  [8])&aStack_498;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"Pass","");
    pTVar24->m_code = QP_TEST_RESULT_PASS;
    (pTVar24->m_description)._M_dataplus._M_p = (pointer)&(pTVar24->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar24->m_description,local_4a8,
               (char *)((long)local_4a8 + (long)dStack_4a0));
    uVar14 = aStack_498._M_allocated_capacity;
    auVar21 = local_4a8;
    if (local_4a8 == (undefined1  [8])&aStack_498) goto LAB_0085caf4;
  }
  else {
    lVar23 = sVar17 + (sVar17 == 0);
    lVar18 = 0;
    lVar22 = 0;
    local_508 = (pointer)0x0;
    local_4b0 = fmt;
    do {
      local_4d8 = (TestLog *)((ulong)local_4d8 & 0xffffffffffffff00);
      dStack_4d0 = INFINITY;
      p_Stack_4c8 = (_Base_ptr)0xfff0000000000000;
      local_548._0_4_ =
           *(float *)((long)(local_280.in0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22);
      local_548._4_4_ =
           *(float *)((long)(local_280.in0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22 + 4);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                (local_220,fmt,(Vector<float,_2> *)local_548);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_4a8,fmt,local_220);
      pIVar15 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_328,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar15->m_data[1].m_lo = (double)local_488;
      pIVar15->m_data[1].m_hi = dStack_480;
      pIVar15->m_data[0].m_hi = (double)aStack_498._M_allocated_capacity;
      *(undefined8 *)(pIVar15->m_data + 1) = aStack_498._8_8_;
      pIVar15->m_data[0].m_hasNaN = local_4a8;
      pIVar15->m_data[0].m_lo = dStack_4a0;
      local_548._0_4_ =
           *(float *)((long)(local_280.in1.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22);
      local_548._4_4_ =
           *(float *)((long)(local_280.in1.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22 + 4);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                (local_220,fmt,(Vector<float,_2> *)local_548);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_4a8,fmt,local_220);
      pIVar15 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_328,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar15->m_data[1].m_lo = (double)local_488;
      pIVar15->m_data[1].m_hi = dStack_480;
      pIVar15->m_data[0].m_hi = (double)aStack_498._M_allocated_capacity;
      *(undefined8 *)(pIVar15->m_data + 1) = aStack_498._8_8_;
      pIVar15->m_data[0].m_hasNaN = local_4a8;
      pIVar15->m_data[0].m_lo = dStack_4a0;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_328,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_328,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      val = (Vector<float,_2> *)fmt->m_maxValue;
      local_4a8 = *(undefined1 (*) [8])fmt;
      dStack_4a0 = *(double *)&fmt->m_fractionBits;
      aStack_498._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
      aStack_498._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      dStack_480 = (double)CONCAT44(dStack_480._4_4_,(this->m_caseCtx).precision);
      local_470 = 0;
      pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_488 = val;
      local_478 = &local_328;
      (*pSVar4->_vptr_Statement[3])(pSVar4,local_4a8);
      x = Environment::lookup<float>
                    ((Environment *)&local_328,
                     (this->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      tcu::FloatFormat::convert((Interval *)local_4a8,&local_2c8,x);
      p_Stack_4c8 = (_Base_ptr)aStack_498._M_allocated_capacity;
      local_4d8 = (TestLog *)local_4a8;
      pTVar10 = local_4d8;
      dStack_4d0 = dStack_4a0;
      fVar2 = *(float *)((long)local_2f8.out0.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar18);
      dVar25 = (double)fVar2;
      dVar9 = dVar25;
      if (NAN(fVar2)) {
        dVar9 = INFINITY;
        dVar25 = -INFINITY;
      }
      IVar19 = (IVal)(dVar25 <= (double)aStack_498._M_allocated_capacity && dStack_4a0 <= dVar9);
      if ((NAN(fVar2)) &&
         (dVar25 <= (double)aStack_498._M_allocated_capacity && dStack_4a0 <= dVar9)) {
        local_4d8._0_1_ = local_4a8[0];
        IVar19 = local_4d8._0_1_;
      }
      local_4a8 = (undefined1  [8])&aStack_498;
      local_4d8 = pTVar10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Shader output 0 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(&local_80,(bool)((byte)IVar19 & 1),(string *)local_4a8);
      if (local_4a8 != (undefined1  [8])&aStack_498) {
        operator_delete((void *)local_4a8,(ulong)(aStack_498._M_allocated_capacity + 1));
      }
      if (!bVar11) {
        uVar13 = (int)local_508 + 1;
        local_508 = (pointer)(ulong)uVar13;
        pdVar20 = &local_220[0].m_data[0].m_hi;
        if ((int)uVar13 < 0x65) {
          local_4a8 = (undefined1  [8])local_510;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_4a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\t",1);
          pVVar6 = (this->m_variables).in0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                   m_ptr;
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_220[0].m_data[0]._0_8_ = pdVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_220,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,(char *)local_220[0].m_data[0]._0_8_,
                     (long)local_220[0].m_data[0].m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_548,(shaderexecutor *)&local_2c8,
                     (FloatFormat *)
                     ((long)(local_280.in0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,(char *)CONCAT44(local_548._4_4_,local_548._0_4_),
                     (long)local_540);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_548._4_4_,local_548._0_4_) != &aStack_538) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_548._4_4_,local_548._0_4_),
                            (ulong)(aStack_538._M_allocated_capacity + 1));
          }
          if ((double *)local_220[0].m_data[0]._0_8_ != pdVar20) {
            operator_delete((void *)local_220[0].m_data[0]._0_8_,
                            (long)local_220[0].m_data[0].m_hi + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\t",1);
          pVVar6 = (this->m_variables).in1.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                   m_ptr;
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_220[0].m_data[0]._0_8_ = pdVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_220,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,(char *)local_220[0].m_data[0]._0_8_,
                     (long)local_220[0].m_data[0].m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_548,(shaderexecutor *)&local_2c8,
                     (FloatFormat *)
                     ((long)(local_280.in1.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar22),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,(char *)CONCAT44(local_548._4_4_,local_548._0_4_),
                     (long)local_540);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_548._4_4_,local_548._0_4_) != &aStack_538) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_548._4_4_,local_548._0_4_),
                            (ulong)(aStack_538._M_allocated_capacity + 1));
          }
          if ((double *)local_220[0].m_data[0]._0_8_ != pdVar20) {
            operator_delete((void *)local_220[0].m_data[0]._0_8_,
                            (long)local_220[0].m_data[0].m_hi + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\t",1);
          pVVar8 = (this->m_variables).out0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
          pcVar7 = (pVVar8->m_name)._M_dataplus._M_p;
          local_220[0].m_data[0]._0_8_ = pdVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_220,pcVar7,pcVar7 + (pVVar8->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,(char *)local_220[0].m_data[0]._0_8_,
                     (long)local_220[0].m_data[0].m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," = ",3);
          valueToString<float>
                    ((string *)local_548,&local_2c8,
                     (float *)((long)local_2f8.out0.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar18));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,(char *)CONCAT44(local_548._4_4_,local_548._0_4_),
                     (long)local_540);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,"\tExpected range: ",0x11);
          intervalToString<float>(&local_500,&local_2c8,(IVal *)&local_4d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,local_500._M_dataplus._M_p,local_500._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500._M_dataplus._M_p != &local_500.field_2) {
            operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_548._4_4_,local_548._0_4_) != &aStack_538) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_548._4_4_,local_548._0_4_),
                            (ulong)(aStack_538._M_allocated_capacity + 1));
          }
          if ((double *)local_220[0].m_data[0]._0_8_ != pdVar20) {
            operator_delete((void *)local_220[0].m_data[0]._0_8_,
                            (long)local_220[0].m_data[0].m_hi + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_4a0);
          std::ios_base::~ios_base(local_430);
          fmt = local_4b0;
        }
      }
      pdVar20 = &local_220[0].m_data[0].m_hi;
      lVar22 = lVar22 + 8;
      lVar18 = lVar18 + 4;
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
    iVar12 = (int)local_508;
    if (iVar12 < 0x65) {
      if (iVar12 == 0) goto LAB_0085c916;
    }
    else {
      local_4a8 = (undefined1  [8])local_510;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_4a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&dStack_4a0,iVar12 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_4a0);
      std::ios_base::~ios_base(local_430);
    }
    local_4a8 = (undefined1  [8])local_510;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_4a0);
    std::ostream::operator<<((ostringstream *)&dStack_4a0,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_4a0);
    std::ios_base::~ios_base(local_430);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
    std::ostream::operator<<(local_4a8,iVar12);
    pTVar24 = local_4b8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
    std::ios_base::~ios_base(local_438);
    local_4a8 = (undefined1  [8])&aStack_498;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4a8," test failed. Check log for the details","");
    uVar14 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_548._4_4_,local_548._0_4_) != &aStack_538) {
      uVar14 = aStack_538._M_allocated_capacity;
    }
    if ((ulong)uVar14 < (_Base_ptr)((long)dStack_4a0 + (long)local_540)) {
      uVar14 = (_Base_ptr)0xf;
      if (local_4a8 != (undefined1  [8])&aStack_498) {
        uVar14 = aStack_498._M_allocated_capacity;
      }
      if ((ulong)uVar14 < (_Base_ptr)((long)dStack_4a0 + (long)local_540)) goto LAB_0085c907;
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)local_4a8,0,(char *)0x0,CONCAT44(local_548._4_4_,local_548._0_4_))
      ;
    }
    else {
LAB_0085c907:
      puVar16 = (undefined8 *)std::__cxx11::string::_M_append(local_548,(ulong)local_4a8);
    }
    pdVar1 = (double *)(puVar16 + 2);
    if ((double *)*puVar16 == pdVar1) {
      local_220[0].m_data[0].m_hi = *pdVar1;
      local_220[0].m_data[1]._0_4_ = *(undefined4 *)(puVar16 + 3);
      local_220[0].m_data[1]._4_4_ = *(undefined4 *)((long)puVar16 + 0x1c);
      local_220[0].m_data[0]._0_8_ = pdVar20;
    }
    else {
      local_220[0].m_data[0].m_hi = *pdVar1;
      local_220[0].m_data[0]._0_8_ = (double *)*puVar16;
    }
    local_220[0].m_data[0].m_lo = (double)puVar16[1];
    *puVar16 = pdVar1;
    puVar16[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar24->m_code = QP_TEST_RESULT_FAIL;
    (pTVar24->m_description)._M_dataplus._M_p = (pointer)&(pTVar24->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar24->m_description,local_220[0].m_data[0]._0_8_,
               (undefined1 *)((long)local_220[0].m_data[0].m_lo + local_220[0].m_data[0]._0_8_));
    if ((double *)local_220[0].m_data[0]._0_8_ != pdVar20) {
      operator_delete((void *)local_220[0].m_data[0]._0_8_,(long)local_220[0].m_data[0].m_hi + 1);
    }
    if (local_4a8 != (undefined1  [8])&aStack_498) {
      operator_delete((void *)local_4a8,(ulong)(aStack_498._M_allocated_capacity + 1));
    }
    auVar21 = (undefined1  [8])CONCAT44(local_548._4_4_,local_548._0_4_);
    uVar14 = aStack_538._M_allocated_capacity;
    if (auVar21 == (undefined1  [8])&aStack_538) goto LAB_0085caf4;
  }
  operator_delete((void *)auVar21,(ulong)((long)&((_Base_ptr)uVar14)->_M_color + 1));
LAB_0085caf4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_328);
  if (local_2f8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_280.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_280.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_280.in1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.in1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.in1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.in1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_280.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar24;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}